

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_readStats(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                    U32 *tableLogPtr,void *src,size_t srcSize)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  bool bVar9;
  FSE_DTable aFStack_138 [68];
  
  sVar2 = 0xffffffffffffffb8;
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  uVar6 = (ulong)*src;
  if ((char)*src < '\0') {
    uVar3 = uVar6 - 0x7e >> 1;
    if (srcSize <= uVar3) {
      return 0xffffffffffffffb8;
    }
    srcSize = uVar6 - 0x7f;
    sVar2 = 0xffffffffffffffec;
    if (hwSize <= srcSize) {
      return 0xffffffffffffffec;
    }
    if (srcSize != 0) {
      pbVar8 = (byte *)((long)src + 1);
      sVar2 = 0;
      do {
        huffWeight[sVar2] = *pbVar8 >> 4;
        huffWeight[sVar2 + 1] = *pbVar8 & 0xf;
        sVar2 = sVar2 + 2;
        pbVar8 = pbVar8 + 1;
      } while ((uint)sVar2 < (uint)srcSize);
    }
  }
  else {
    if (uVar6 < srcSize) {
      sVar2 = FSE_decompress_wksp(huffWeight,hwSize - 1,(void *)((long)src + 1),uVar6,aFStack_138,6)
      ;
      bVar9 = sVar2 < 0xffffffffffffff89;
      srcSize = sVar2;
    }
    else {
      bVar9 = false;
    }
    uVar3 = uVar6;
    if (!bVar9) {
      return sVar2;
    }
  }
  rankStats[5] = 0;
  rankStats[6] = 0;
  rankStats[7] = 0;
  rankStats[8] = 0;
  rankStats[9] = 0;
  rankStats[10] = 0;
  rankStats[0xb] = 0;
  rankStats[0xc] = 0;
  rankStats[0] = 0;
  rankStats[1] = 0;
  rankStats[2] = 0;
  rankStats[3] = 0;
  rankStats[4] = 0;
  rankStats[5] = 0;
  rankStats[6] = 0;
  rankStats[7] = 0;
  uVar4 = 0;
  bVar9 = srcSize != 0;
  if (bVar9) {
    bVar7 = *huffWeight;
    if (bVar7 < 0xc) {
      uVar4 = 0;
      uVar5 = 1;
      pbVar8 = huffWeight;
      do {
        rankStats[bVar7] = rankStats[bVar7] + 1;
        uVar4 = ((1 << (*pbVar8 & 0x1f)) >> 1) + uVar4;
        uVar6 = (ulong)uVar5;
        bVar9 = uVar6 < srcSize;
        if (srcSize <= uVar6) goto LAB_0010d214;
        pbVar8 = huffWeight + uVar6;
        bVar7 = huffWeight[uVar6];
        uVar5 = uVar5 + 1;
      } while (bVar7 < 0xc);
    }
    sVar2 = 0xffffffffffffffec;
  }
LAB_0010d214:
  if (!bVar9) {
    if (uVar4 == 0) {
      sVar2 = 0xffffffffffffffec;
    }
    else {
      uVar5 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      sVar1 = 0xffffffffffffffec;
      if (uVar5 < 0xc) {
        *tableLogPtr = 0x20 - (uVar5 ^ 0x1f);
        uVar4 = (2 << ((byte)uVar5 & 0x1f)) - uVar4;
        if (uVar4 == 0) {
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5a1,"unsigned int BIT_highbit32(U32)");
        }
        uVar5 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        bVar9 = 1 << ((byte)uVar5 & 0x1f) == uVar4;
        if (bVar9) {
          uVar4 = 0x20 - (uVar5 ^ 0x1f);
          huffWeight[srcSize] = (BYTE)uVar4;
          rankStats[uVar4] = rankStats[uVar4] + 1;
          bVar9 = true;
          sVar1 = sVar2;
        }
      }
      else {
        bVar9 = false;
      }
      sVar2 = sVar1;
      if ((bVar9) && (sVar2 = 0xffffffffffffffec, (rankStats[1] & 1) == 0 && 1 < rankStats[1])) {
        *nbSymbolsPtr = (int)srcSize + 1;
        sVar2 = uVar3 + 1;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t HUF_readStats(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize)
{
    U32 weightTotal;
    const BYTE* ip = (const BYTE*) src;
    size_t iSize;
    size_t oSize;

    if (!srcSize) return ERROR(srcSize_wrong);
    iSize = ip[0];
    /* memset(huffWeight, 0, hwSize);   *//* is not necessary, even though some analyzer complain ... */

    if (iSize >= 128) {  /* special header */
        oSize = iSize - 127;
        iSize = ((oSize+1)/2);
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        if (oSize >= hwSize) return ERROR(corruption_detected);
        ip += 1;
        {   U32 n;
            for (n=0; n<oSize; n+=2) {
                huffWeight[n]   = ip[n/2] >> 4;
                huffWeight[n+1] = ip[n/2] & 15;
    }   }   }
    else  {   /* header compressed with FSE (normal case) */
        FSE_DTable fseWorkspace[FSE_DTABLE_SIZE_U32(6)];  /* 6 is max possible tableLog for HUF header (maybe even 5, to be tested) */
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        oSize = FSE_decompress_wksp(huffWeight, hwSize-1, ip+1, iSize, fseWorkspace, 6);   /* max (hwSize-1) values decoded, as last one is implied */
        if (FSE_isError(oSize)) return oSize;
    }

    /* collect weight stats */
    memset(rankStats, 0, (HUF_TABLELOG_MAX + 1) * sizeof(U32));
    weightTotal = 0;
    {   U32 n; for (n=0; n<oSize; n++) {
            if (huffWeight[n] >= HUF_TABLELOG_MAX) return ERROR(corruption_detected);
            rankStats[huffWeight[n]]++;
            weightTotal += (1 << huffWeight[n]) >> 1;
    }   }
    if (weightTotal == 0) return ERROR(corruption_detected);

    /* get last non-null symbol weight (implied, total must be 2^n) */
    {   U32 const tableLog = BIT_highbit32(weightTotal) + 1;
        if (tableLog > HUF_TABLELOG_MAX) return ERROR(corruption_detected);
        *tableLogPtr = tableLog;
        /* determine last weight */
        {   U32 const total = 1 << tableLog;
            U32 const rest = total - weightTotal;
            U32 const verif = 1 << BIT_highbit32(rest);
            U32 const lastWeight = BIT_highbit32(rest) + 1;
            if (verif != rest) return ERROR(corruption_detected);    /* last value must be a clean power of 2 */
            huffWeight[oSize] = (BYTE)lastWeight;
            rankStats[lastWeight]++;
    }   }

    /* check tree construction validity */
    if ((rankStats[1] < 2) || (rankStats[1] & 1)) return ERROR(corruption_detected);   /* by construction : at least 2 elts of rank 1, must be even */

    /* results */
    *nbSymbolsPtr = (U32)(oSize+1);
    return iSize+1;
}